

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Untee.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall wasm::Untee::create(Untee *this)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(0x108);
  memset(__s,0,0xe0);
  __s[2] = (_func_int *)(__s + 4);
  __s[6] = (_func_int *)0x0;
  __s[7] = (_func_int *)0x0;
  __s[0x1c] = (_func_int *)0x0;
  __s[0x1d] = (_func_int *)0x0;
  __s[0x1e] = (_func_int *)0x0;
  __s[0x1f] = (_func_int *)0x0;
  __s[0x20] = (_func_int *)0x0;
  *__s = (_func_int *)&PTR__WalkerPass_00d76770;
  (this->super_WalkerPass<wasm::PostWalker<wasm::Untee,_wasm::Visitor<wasm::Untee,_void>_>_>).
  super_Pass._vptr_Pass = __s;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override { return std::make_unique<Untee>(); }